

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<int>::GetSub(TPZMatrix<int> *this,TPZVec<long> *indices,TPZFMatrix<int> *block)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = indices->fNElements;
  if (0 < lVar1) {
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,indices->fStore[lVar4],indices->fStore[lVar5]);
        lVar2 = (block->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow;
        if ((lVar2 <= lVar4) || ((block->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        block->fElem[lVar2 * lVar5 + lVar4] = iVar3;
        lVar5 = lVar5 + 1;
      } while (lVar1 != lVar5);
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar1);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::GetSub(const TPZVec<int64_t> &indices,TPZFMatrix<TVar> &block) const
{
    int64_t nel = indices.NElements();
    int64_t iel,jel;
    for(iel=0; iel<nel; iel++)
    {
		for(jel=0; jel<nel; jel++)
		{
			block(iel,jel) = GetVal(indices[iel],indices[jel]);
		}
    }
	
}